

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::Impl::emit_entry_point
          (Impl *this,ExecutionModel model,char *name,bool physical_storage)

{
  Function *pFVar1;
  Instruction *pIVar2;
  bool physical_storage_local;
  char *name_local;
  ExecutionModel model_local;
  Impl *this_local;
  
  this->execution_model = model;
  spv::Builder::addCapability(&this->builder,CapabilityShader);
  if (physical_storage) {
    spv::Builder::setMemoryModel
              (&this->builder,AddressingModelPhysicalStorageBuffer64,MemoryModelGLSL450);
    spv::Builder::addCapability(&this->builder,CapabilityPhysicalStorageBufferAddresses);
    spv::Builder::addExtension(&this->builder,"SPV_KHR_physical_storage_buffer");
  }
  else {
    spv::Builder::setMemoryModel(&this->builder,AddressingModelLogical,MemoryModelGLSL450);
  }
  pFVar1 = spv::Builder::makeEntryPoint(&this->builder,"main");
  this->entry_function = pFVar1;
  pIVar2 = spv::Builder::addEntryPoint(&this->builder,model,this->entry_function,name);
  this->entry_point = pIVar2;
  if (model == ExecutionModelFragment) {
    spv::Builder::addExecutionMode
              (&this->builder,this->entry_function,ExecutionModeOriginUpperLeft,-1,-1,-1);
  }
  if (((this->instruction_instrumentation).info.enabled & 1U) != 0) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_float_controls");
    spv::Builder::addCapability(&this->builder,CapabilitySignedZeroInfNanPreserve);
    if (((this->instruction_instrumentation).info.fp16 & 1U) != 0) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
      spv::Builder::addExecutionMode
                (&this->builder,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x10,-1,
                 -1);
    }
    if (((this->instruction_instrumentation).info.fp32 & 1U) != 0) {
      spv::Builder::addExecutionMode
                (&this->builder,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x20,-1,
                 -1);
    }
    if (((this->instruction_instrumentation).info.fp64 & 1U) != 0) {
      spv::Builder::addExecutionMode
                (&this->builder,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x40,-1,
                 -1);
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::emit_entry_point(spv::ExecutionModel model, const char *name, bool physical_storage)
{
	execution_model = model;
	builder.addCapability(spv::Capability::CapabilityShader);

	if (physical_storage)
	{
		builder.setMemoryModel(spv::AddressingModel::AddressingModelPhysicalStorageBuffer64, spv::MemoryModelGLSL450);
		builder.addCapability(spv::CapabilityPhysicalStorageBufferAddresses);
		builder.addExtension("SPV_KHR_physical_storage_buffer");
	}
	else
		builder.setMemoryModel(spv::AddressingModel::AddressingModelLogical, spv::MemoryModel::MemoryModelGLSL450);

	entry_function = builder.makeEntryPoint("main");
	entry_point = builder.addEntryPoint(model, entry_function, name);
	if (model == spv::ExecutionModel::ExecutionModelFragment)
		builder.addExecutionMode(entry_function, spv::ExecutionModeOriginUpperLeft);

	if (instruction_instrumentation.info.enabled)
	{
		builder.addExtension("SPV_KHR_float_controls");
		builder.addCapability(spv::CapabilitySignedZeroInfNanPreserve);

		if (instruction_instrumentation.info.fp16)
		{
			builder.addCapability(spv::CapabilityFloat16);
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 16);
		}

		if (instruction_instrumentation.info.fp32)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 32);

		if (instruction_instrumentation.info.fp64)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 64);
	}
}